

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlSaveDocInternal(xmlSaveCtxtPtr ctxt,xmlDocPtr cur,xmlChar *encoding)

{
  xmlOutputBufferPtr out;
  bool bVar1;
  int iVar2;
  xmlDtdPtr pxVar3;
  xmlNodePtr local_50;
  xmlNodePtr child;
  int format;
  int switched_encoding;
  xmlOutputBufferPtr buf;
  int is_xhtml;
  xmlDtdPtr dtd;
  xmlChar *encoding_local;
  xmlDocPtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  out = ctxt->buf;
  bVar1 = false;
  xmlInitParser();
  if ((cur->type == XML_HTML_DOCUMENT_NODE) || (cur->type == XML_DOCUMENT_NODE)) {
    dtd = (xmlDtdPtr)encoding;
    if (encoding == (xmlChar *)0x0) {
      dtd = (xmlDtdPtr)cur->encoding;
    }
    if ((((cur->type == XML_HTML_DOCUMENT_NODE) && ((ctxt->options & 0x20U) == 0)) &&
        ((ctxt->options & 0x10U) == 0)) || ((ctxt->options & 0x40U) != 0)) {
      if (dtd != (xmlDtdPtr)0x0) {
        htmlSetMetaEncoding(cur,(xmlChar *)dtd);
      }
      if (ctxt->encoding == (xmlChar *)0x0) {
        if ((dtd == (xmlDtdPtr)0x0) &&
           (dtd = (xmlDtdPtr)htmlGetMetaEncoding(cur), dtd == (xmlDtdPtr)0x0)) {
          dtd = (xmlDtdPtr)anon_var_dwarf_2e50;
        }
        iVar2 = xmlSaveSwitchEncoding(ctxt,(char *)dtd);
        if (iVar2 < 0) {
          return -1;
        }
        bVar1 = true;
      }
      child._0_4_ = (uint)((ctxt->options & 1U) != 0);
      htmlDocContentDumpFormatOutput(out,cur,(char *)0x0,(uint)child);
    }
    else if (((cur->type == XML_DOCUMENT_NODE) || ((ctxt->options & 0x20U) != 0)) ||
            ((ctxt->options & 0x10U) != 0)) {
      if ((dtd != (xmlDtdPtr)0x0) && (ctxt->encoding == (xmlChar *)0x0)) {
        iVar2 = xmlSaveSwitchEncoding(ctxt,(char *)dtd);
        if (iVar2 < 0) {
          return -1;
        }
        bVar1 = true;
      }
      if ((ctxt->options & 2U) == 0) {
        xmlOutputBufferWrite(out,0xe,"<?xml version=");
        if (cur->version == (xmlChar *)0x0) {
          xmlOutputBufferWrite(out,5,"\"1.0\"");
        }
        else {
          xmlOutputBufferWriteQuotedString(out,cur->version);
        }
        if (dtd != (xmlDtdPtr)0x0) {
          xmlOutputBufferWrite(out,10," encoding=");
          xmlOutputBufferWriteQuotedString(out,(xmlChar *)dtd);
        }
        if (cur->standalone == 0) {
          xmlOutputBufferWrite(out,0x10," standalone=\"no\"");
        }
        else if (cur->standalone == 1) {
          xmlOutputBufferWrite(out,0x11," standalone=\"yes\"");
        }
        xmlOutputBufferWrite(out,3,"?>\n");
      }
      buf._4_4_ = (uint)((ctxt->options & 0x10U) != 0);
      if ((((ctxt->options & 8U) == 0) && (pxVar3 = xmlGetIntSubset(cur), pxVar3 != (xmlDtdPtr)0x0))
         && (buf._4_4_ = xmlIsXHTML(pxVar3->SystemID,pxVar3->ExternalID), (int)buf._4_4_ < 0)) {
        buf._4_4_ = 0;
      }
      if (cur->children != (_xmlNode *)0x0) {
        for (local_50 = cur->children; local_50 != (xmlNodePtr)0x0; local_50 = local_50->next) {
          ctxt->level = 0;
          if (buf._4_4_ == 0) {
            xmlNodeDumpOutputInternal(ctxt,local_50);
          }
          else {
            xhtmlNodeDumpOutput(ctxt,local_50);
          }
          if ((local_50->type != XML_XINCLUDE_START) && (local_50->type != XML_XINCLUDE_END)) {
            xmlOutputBufferWrite(out,1,"\n");
          }
        }
      }
    }
    if (bVar1) {
      xmlSaveClearEncoding(ctxt);
    }
    ctxt_local._4_4_ = 0;
  }
  else {
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSaveDocInternal(xmlSaveCtxtPtr ctxt, xmlDocPtr cur,
                   const xmlChar *encoding) {
#ifdef LIBXML_HTML_ENABLED
    xmlDtdPtr dtd;
    int is_xhtml = 0;
#endif
    xmlOutputBufferPtr buf = ctxt->buf;
    int switched_encoding = 0;

    xmlInitParser();

    if ((cur->type != XML_HTML_DOCUMENT_NODE) &&
        (cur->type != XML_DOCUMENT_NODE))
	 return(-1);

    if (encoding == NULL)
	encoding = cur->encoding;

    if (((cur->type == XML_HTML_DOCUMENT_NODE) &&
         ((ctxt->options & XML_SAVE_AS_XML) == 0) &&
         ((ctxt->options & XML_SAVE_XHTML) == 0)) ||
        (ctxt->options & XML_SAVE_AS_HTML)) {
#ifdef LIBXML_HTML_ENABLED
        int format = 0;

        if (encoding != NULL)
	    htmlSetMetaEncoding(cur, encoding);

	if (ctxt->encoding == NULL) {
            if (encoding == NULL) {
                encoding = htmlGetMetaEncoding(cur);

                if (encoding == NULL)
                    encoding = BAD_CAST "HTML";
            }

	    if (xmlSaveSwitchEncoding(ctxt, (const char*) encoding) < 0) {
		return(-1);
	    }
            switched_encoding = 1;
	}

        if (ctxt->options & XML_SAVE_FORMAT)
            format = 1;
        htmlDocContentDumpFormatOutput(buf, cur, NULL, format);
#else
        return(-1);
#endif
    } else if ((cur->type == XML_DOCUMENT_NODE) ||
               (ctxt->options & XML_SAVE_AS_XML) ||
               (ctxt->options & XML_SAVE_XHTML)) {
	if ((encoding != NULL) && (ctxt->encoding == NULL)) {
            if (xmlSaveSwitchEncoding(ctxt, (const char *) encoding) < 0)
                return(-1);
            switched_encoding = 1;
	}

	/*
	 * Save the XML declaration
	 */
	if ((ctxt->options & XML_SAVE_NO_DECL) == 0) {
	    xmlOutputBufferWrite(buf, 14, "<?xml version=");
	    if (cur->version != NULL)
		xmlOutputBufferWriteQuotedString(buf, cur->version);
	    else
		xmlOutputBufferWrite(buf, 5, "\"1.0\"");
	    if (encoding != NULL) {
		xmlOutputBufferWrite(buf, 10, " encoding=");
		xmlOutputBufferWriteQuotedString(buf, (xmlChar *) encoding);
	    }
	    switch (cur->standalone) {
		case 0:
		    xmlOutputBufferWrite(buf, 16, " standalone=\"no\"");
		    break;
		case 1:
		    xmlOutputBufferWrite(buf, 17, " standalone=\"yes\"");
		    break;
	    }
	    xmlOutputBufferWrite(buf, 3, "?>\n");
	}

#ifdef LIBXML_HTML_ENABLED
        if (ctxt->options & XML_SAVE_XHTML)
            is_xhtml = 1;
	if ((ctxt->options & XML_SAVE_NO_XHTML) == 0) {
	    dtd = xmlGetIntSubset(cur);
	    if (dtd != NULL) {
		is_xhtml = xmlIsXHTML(dtd->SystemID, dtd->ExternalID);
		if (is_xhtml < 0) is_xhtml = 0;
	    }
	}
#endif
	if (cur->children != NULL) {
	    xmlNodePtr child = cur->children;

	    while (child != NULL) {
		ctxt->level = 0;
#ifdef LIBXML_HTML_ENABLED
		if (is_xhtml)
		    xhtmlNodeDumpOutput(ctxt, child);
		else
#endif
		    xmlNodeDumpOutputInternal(ctxt, child);
                if ((child->type != XML_XINCLUDE_START) &&
                    (child->type != XML_XINCLUDE_END))
                    xmlOutputBufferWrite(buf, 1, "\n");
		child = child->next;
	    }
	}
    }

    /*
     * Restore the state of the saving context at the end of the document
     */
    if (switched_encoding) {
	xmlSaveClearEncoding(ctxt);
    }

    return(0);
}